

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseComment(xmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  int *piVar2;
  xmlChar xVar3;
  xmlParserInputPtr pxVar4;
  commentSAXFunc p_Var5;
  xmlChar *pxVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  size_t len;
  xmlChar *pxVar10;
  xmlChar *pxVar11;
  ulong __n;
  char *msg;
  ulong local_40;
  
  lVar8 = 1000000000;
  if ((ctxt->options & 0x80000) == 0) {
    lVar8 = 10000000;
  }
  pxVar4 = ctxt->input;
  pxVar10 = pxVar4->cur;
  if ((*pxVar10 == '<') && (pxVar10[1] == '!')) {
    pxVar4->cur = pxVar10 + 2;
    pxVar4->col = pxVar4->col + 2;
    if (pxVar10[2] == '\0') {
      xmlParserGrow(ctxt);
    }
    pxVar4 = ctxt->input;
    pxVar10 = pxVar4->cur;
    if ((*pxVar10 == '-') && (pxVar10[1] == '-')) {
      pxVar4->cur = pxVar10 + 2;
      pxVar4->col = pxVar4->col + 2;
      if (pxVar10[2] == '\0') {
        xmlParserGrow(ctxt);
      }
      pxVar4 = ctxt->input;
      if (((pxVar4->flags & 0x40) == 0) && ((long)pxVar4->end - (long)pxVar4->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      pxVar10 = ctxt->input->cur;
      local_40 = 100;
      len = 0;
      pxVar11 = (xmlChar *)0x0;
      do {
        if (*pxVar10 == '\n') {
          pxVar4 = ctxt->input;
          iVar7 = pxVar4->line;
          pxVar6 = pxVar10;
          do {
            iVar7 = iVar7 + 1;
            pxVar4->line = iVar7;
            pxVar4->col = 1;
            pxVar10 = pxVar6 + 1;
            pxVar1 = pxVar6 + 1;
            pxVar6 = pxVar10;
          } while (*pxVar1 == '\n');
        }
        while( true ) {
          while( true ) {
            pxVar4 = ctxt->input;
            iVar7 = pxVar4->col;
            while( true ) {
              for (; (xVar3 = *pxVar10, '-' < (char)xVar3 ||
                     (xVar3 == '\t' || (byte)(xVar3 - 0x20) < 0xd)); pxVar10 = pxVar10 + 1) {
                iVar7 = iVar7 + 1;
              }
              pxVar4->col = iVar7;
              if (*pxVar10 != '\n') break;
              iVar7 = pxVar4->line;
              do {
                iVar7 = iVar7 + 1;
                pxVar4->line = iVar7;
                pxVar4->col = 1;
                pxVar6 = pxVar10 + 1;
                pxVar10 = pxVar10 + 1;
              } while (*pxVar6 == '\n');
              iVar7 = 1;
            }
            __n = (long)pxVar10 - (long)pxVar4->cur;
            pxVar6 = pxVar11;
            if (__n != 0) {
              if (lVar8 - len < __n) {
                xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_COMMENT_NOT_FINISHED,
                           XML_ERR_FATAL,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,
                           "Comment too big found",0);
                goto LAB_00135f42;
              }
              if (pxVar11 == (xmlChar *)0x0) {
                if ((*pxVar10 != '-') || (lVar9 = 1, pxVar10[1] != '-')) {
                  lVar9 = 100;
                }
                local_40 = lVar9 + __n;
                pxVar6 = (xmlChar *)(*xmlMalloc)(local_40);
                if (pxVar6 == (xmlChar *)0x0) {
                  xmlCtxtErrMemory(ctxt);
                  return;
                }
                len = 0;
              }
              else if (local_40 <= __n + len + 1) {
                local_40 = local_40 + __n + len + 100;
                pxVar6 = (xmlChar *)(*xmlRealloc)(pxVar11,local_40);
                if (pxVar6 == (xmlChar *)0x0) {
                  xmlCtxtErrMemory(ctxt);
                  (*xmlFree)(pxVar11);
                  return;
                }
              }
              memcpy(pxVar6 + len,ctxt->input->cur,__n);
              len = len + __n;
              pxVar6[len] = '\0';
            }
            pxVar4 = ctxt->input;
            pxVar4->cur = pxVar10;
            if (*pxVar10 == '\n') {
              pxVar10 = pxVar10 + 1;
              pxVar4->line = pxVar4->line + 1;
              pxVar4->col = 1;
            }
            pxVar11 = pxVar6;
            if ((*pxVar10 != '\r') || (pxVar10[1] != '\n')) break;
            pxVar4->cur = pxVar10 + 1;
            pxVar10 = pxVar10 + 2;
            pxVar4->line = pxVar4->line + 1;
            pxVar4->col = 1;
          }
          if ((pxVar4->flags & 0x40) == 0) {
            xmlParserShrink(ctxt);
          }
          pxVar4 = ctxt->input;
          if (((pxVar4->flags & 0x40) == 0) && ((long)pxVar4->end - (long)pxVar4->cur < 0xfa)) {
            xmlParserGrow(ctxt);
          }
          pxVar4 = ctxt->input;
          pxVar10 = pxVar4->cur;
          xVar3 = *pxVar10;
          if (xVar3 != '-') break;
          if (pxVar10[1] == '-') {
            if (pxVar10[2] == '>') {
              pxVar4->cur = pxVar10 + 3;
              pxVar4->col = pxVar4->col + 3;
              if (pxVar10[3] == '\0') {
                xmlParserGrow(ctxt);
              }
              if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                  (p_Var5 = ctxt->sax->comment, p_Var5 != (commentSAXFunc)0x0)) &&
                 (ctxt->disableSAX == 0)) {
                pxVar10 = "";
                if (pxVar6 != (xmlChar *)0x0) {
                  pxVar10 = pxVar6;
                }
                (*p_Var5)(ctxt->userData,pxVar10);
              }
              if (pxVar6 == (xmlChar *)0x0) {
                return;
              }
LAB_00135f42:
              (*xmlFree)(pxVar11);
              return;
            }
            if (pxVar6 == (xmlChar *)0x0) {
              msg = "Double hyphen within comment\n";
              pxVar6 = (xmlChar *)0x0;
            }
            else {
              msg = "Double hyphen within comment: <!--%.50s\n";
            }
            xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_HYPHEN_IN_COMMENT,XML_ERR_FATAL,
                       pxVar6,(xmlChar *)0x0,(xmlChar *)0x0,0,msg,pxVar6);
            pxVar10 = pxVar10 + 1;
            piVar2 = &ctxt->input->col;
            *piVar2 = *piVar2 + 1;
          }
          pxVar10 = pxVar10 + 1;
          piVar2 = &ctxt->input->col;
          *piVar2 = *piVar2 + 1;
        }
        if (1 < (byte)(xVar3 - 9) && (char)xVar3 < ' ') {
          xmlParseCommentComplex(ctxt,pxVar6,len,local_40);
          return;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void
xmlParseComment(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    size_t size = XML_PARSER_BUFFER_SIZE;
    size_t len = 0;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_TEXT_LENGTH;
    const xmlChar *in;
    size_t nbchar = 0;
    int ccol;

    /*
     * Check that there is a comment right here.
     */
    if ((RAW != '<') || (NXT(1) != '!'))
        return;
    SKIP(2);
    if ((RAW != '-') || (NXT(1) != '-'))
        return;
    SKIP(2);
    GROW;

    /*
     * Accelerated common case where input don't need to be
     * modified before passing it to the handler.
     */
    in = ctxt->input->cur;
    do {
	if (*in == 0xA) {
	    do {
		ctxt->input->line++; ctxt->input->col = 1;
		in++;
	    } while (*in == 0xA);
	}
get_more:
        ccol = ctxt->input->col;
	while (((*in > '-') && (*in <= 0x7F)) ||
	       ((*in >= 0x20) && (*in < '-')) ||
	       (*in == 0x09)) {
		    in++;
		    ccol++;
	}
	ctxt->input->col = ccol;
	if (*in == 0xA) {
	    do {
		ctxt->input->line++; ctxt->input->col = 1;
		in++;
	    } while (*in == 0xA);
	    goto get_more;
	}
	nbchar = in - ctxt->input->cur;
	/*
	 * save current set of data
	 */
	if (nbchar > 0) {
            if (nbchar > maxLength - len) {
                xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
                                  "Comment too big found", NULL);
                xmlFree(buf);
                return;
            }
            if (buf == NULL) {
                if ((*in == '-') && (in[1] == '-'))
                    size = nbchar + 1;
                else
                    size = XML_PARSER_BUFFER_SIZE + nbchar;
                buf = xmlMalloc(size);
                if (buf == NULL) {
                    xmlErrMemory(ctxt);
                    return;
                }
                len = 0;
            } else if (len + nbchar + 1 >= size) {
                xmlChar *new_buf;
                size += len + nbchar + XML_PARSER_BUFFER_SIZE;
                new_buf = xmlRealloc(buf, size);
                if (new_buf == NULL) {
                    xmlErrMemory(ctxt);
                    xmlFree(buf);
                    return;
                }
                buf = new_buf;
            }
            memcpy(&buf[len], ctxt->input->cur, nbchar);
            len += nbchar;
            buf[len] = 0;
	}
	ctxt->input->cur = in;
	if (*in == 0xA) {
	    in++;
	    ctxt->input->line++; ctxt->input->col = 1;
	}
	if (*in == 0xD) {
	    in++;
	    if (*in == 0xA) {
		ctxt->input->cur = in;
		in++;
		ctxt->input->line++; ctxt->input->col = 1;
		goto get_more;
	    }
	    in--;
	}
	SHRINK;
	GROW;
	in = ctxt->input->cur;
	if (*in == '-') {
	    if (in[1] == '-') {
	        if (in[2] == '>') {
		    SKIP(3);
		    if ((ctxt->sax != NULL) && (ctxt->sax->comment != NULL) &&
		        (!ctxt->disableSAX)) {
			if (buf != NULL)
			    ctxt->sax->comment(ctxt->userData, buf);
			else
			    ctxt->sax->comment(ctxt->userData, BAD_CAST "");
		    }
		    if (buf != NULL)
		        xmlFree(buf);
		    return;
		}
		if (buf != NULL) {
		    xmlFatalErrMsgStr(ctxt, XML_ERR_HYPHEN_IN_COMMENT,
		                      "Double hyphen within comment: "
                                      "<!--%.50s\n",
				      buf);
		} else
		    xmlFatalErrMsgStr(ctxt, XML_ERR_HYPHEN_IN_COMMENT,
		                      "Double hyphen within comment\n", NULL);
		in++;
		ctxt->input->col++;
	    }
	    in++;
	    ctxt->input->col++;
	    goto get_more;
	}
    } while (((*in >= 0x20) && (*in <= 0x7F)) || (*in == 0x09) || (*in == 0x0a));
    xmlParseCommentComplex(ctxt, buf, len, size);
}